

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O3

mqtt_queued_message * mqtt_mq_register(mqtt_message_queue *mq,size_t nbytes)

{
  uint8_t *puVar1;
  mqtt_queued_message *pmVar2;
  mqtt_queued_message *pmVar3;
  size_t sVar4;
  size_t sVar5;
  
  puVar1 = mq->curr;
  pmVar2 = mq->queue_tail;
  mq->queue_tail = pmVar2 + -1;
  pmVar2[-1].start = puVar1;
  pmVar2[-1].size = nbytes;
  pmVar2[-1].state = MQTT_QUEUED_UNSENT;
  pmVar3 = (mqtt_queued_message *)(puVar1 + nbytes);
  sVar4 = (long)(pmVar2 + -2) - (long)pmVar3;
  sVar5 = 0;
  if (pmVar3 <= pmVar2 + -2 && sVar4 != 0) {
    sVar5 = sVar4;
  }
  mq->curr = (uint8_t *)pmVar3;
  mq->curr_sz = sVar5;
  return pmVar2 + -1;
}

Assistant:

struct mqtt_queued_message* mqtt_mq_register(struct mqtt_message_queue *mq, size_t nbytes)
{
    /* make queued message header */
    --(mq->queue_tail);
    mq->queue_tail->start = mq->curr;
    mq->queue_tail->size = nbytes;
    mq->queue_tail->state = MQTT_QUEUED_UNSENT;

    /* move curr and recalculate curr_sz */
    mq->curr += nbytes;
    mq->curr_sz = (size_t) (mqtt_mq_currsz(mq));

    return mq->queue_tail;
}